

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

void Tim_ManPrint(Tim_Man_t *p)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Tim_Box_t *pBox_00;
  Tim_Obj_t *pTVar8;
  float *pfVar9;
  bool bVar10;
  int k_1;
  int TableY;
  int TableX;
  int k;
  int j;
  int i;
  float *pTable;
  Tim_Obj_t *pPrev;
  Tim_Obj_t *pObj;
  Tim_Box_t *pBox;
  Tim_Man_t *p_local;
  
  if (p != (Tim_Man_t *)0x0) {
    printf("TIMING MANAGER:\n");
    uVar2 = Tim_ManPiNum(p);
    uVar3 = Tim_ManCiNum(p);
    uVar4 = Tim_ManPoNum(p);
    uVar5 = Tim_ManCoNum(p);
    uVar6 = Tim_ManBoxNum(p);
    printf("PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
           (ulong)uVar5,(ulong)uVar6);
    pTVar8 = p->pCis;
    k = 0;
    while( true ) {
      bVar10 = false;
      if (k < p->nCis) {
        pPrev = p->pCis + k;
        bVar10 = pPrev != (Tim_Obj_t *)0x0;
      }
      if ((!bVar10) ||
         ((pPrev->iObj2Box < 0 &&
          ((((pTVar8->timeArr != pPrev->timeArr || (NAN(pTVar8->timeArr) || NAN(pPrev->timeArr))) ||
            (pTVar8->timeReq != pPrev->timeReq)) || (NAN(pTVar8->timeReq) || NAN(pPrev->timeReq)))))
         )) break;
      k = k + 1;
    }
    iVar7 = Tim_ManCiNum(p);
    if (k == iVar7) {
      printf("All PIs     :  arrival = %5.3f  required = %5.3f\n",(double)pTVar8->timeArr,
             (double)pTVar8->timeReq);
    }
    else {
      k = 0;
      while( true ) {
        bVar10 = false;
        if (k < p->nCis) {
          pPrev = p->pCis + k;
          bVar10 = pPrev != (Tim_Obj_t *)0x0;
        }
        if (!bVar10) break;
        if (pPrev->iObj2Box < 0) {
          printf("PI%5d     :  arrival = %5.3f  required = %5.3f\n",(double)pPrev->timeArr,
                 (double)pPrev->timeReq,(ulong)(uint)k);
        }
        k = k + 1;
      }
    }
    pTVar8 = p->pCos;
    k = 0;
    while( true ) {
      bVar10 = false;
      if (k < p->nCos) {
        pPrev = p->pCos + k;
        bVar10 = pPrev != (Tim_Obj_t *)0x0;
      }
      if ((!bVar10) ||
         ((pPrev->iObj2Box < 0 &&
          (((pTVar8->timeArr != pPrev->timeArr || (NAN(pTVar8->timeArr) || NAN(pPrev->timeArr))) ||
           ((pTVar8->timeReq != pPrev->timeReq || (NAN(pTVar8->timeReq) || NAN(pPrev->timeReq)))))))
         )) break;
      k = k + 1;
    }
    iVar7 = Tim_ManCoNum(p);
    if (k == iVar7) {
      printf("All POs     :  arrival = %5.3f  required = %5.3f\n",(double)pTVar8->timeArr,
             (double)pTVar8->timeReq);
    }
    else {
      k = 0;
      while( true ) {
        bVar10 = false;
        if (k < p->nCos) {
          pPrev = p->pCos + k;
          bVar10 = pPrev != (Tim_Obj_t *)0x0;
        }
        if (!bVar10) break;
        if (pPrev->iObj2Box < 0) {
          printf("PO%5d     :  arrival = %5.3f  required = %5.3f\n",(double)pPrev->timeArr,
                 (double)pPrev->timeReq);
        }
        k = k + 1;
      }
    }
    iVar7 = Tim_ManBoxNum(p);
    if (0 < iVar7) {
      for (k = 0; iVar7 = Vec_PtrSize(p->vBoxes), k < iVar7; k = k + 1) {
        pBox_00 = (Tim_Box_t *)Vec_PtrEntry(p->vBoxes,k);
        uVar2 = pBox_00->nInputs;
        uVar3 = pBox_00->nOutputs;
        uVar4 = Tim_ManBoxInputFirst(p,k);
        uVar5 = Tim_ManBoxOutputFirst(p,k);
        printf("*** Box %5d :  I =%4d. O =%4d. I1 =%6d. O1 =%6d. Table =%4d\n",(ulong)(uint)k,
               (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,pBox_00->iDelayTable);
        pTVar8 = Tim_ManBoxInput(p,pBox_00,0);
        TableY = 0;
        while( true ) {
          bVar10 = false;
          if (TableY < pBox_00->nInputs) {
            pPrev = Tim_ManBoxInput(p,pBox_00,TableY);
            bVar10 = pPrev != (Tim_Obj_t *)0x0;
          }
          if (((!bVar10) || (pTVar8->timeArr != pPrev->timeArr)) ||
             ((NAN(pTVar8->timeArr) || NAN(pPrev->timeArr) ||
              ((pTVar8->timeReq != pPrev->timeReq || (NAN(pTVar8->timeReq) || NAN(pPrev->timeReq))))
              ))) break;
          TableY = TableY + 1;
        }
        iVar7 = Tim_ManBoxInputNum(p,pBox_00->iBox);
        if (TableY == iVar7) {
          printf("Box inputs  :  arrival = %5.3f  required = %5.3f\n",(double)pTVar8->timeArr,
                 (double)pTVar8->timeReq);
        }
        else {
          TableY = 0;
          while( true ) {
            bVar10 = false;
            if (TableY < pBox_00->nInputs) {
              pPrev = Tim_ManBoxInput(p,pBox_00,TableY);
              bVar10 = pPrev != (Tim_Obj_t *)0x0;
            }
            if (!bVar10) break;
            printf("box-in%4d :  arrival = %5.3f  required = %5.3f\n",(double)pPrev->timeArr,
                   (double)pPrev->timeReq,(ulong)(uint)TableY);
            TableY = TableY + 1;
          }
        }
        pTVar8 = Tim_ManBoxOutput(p,pBox_00,0);
        TableY = 0;
        while( true ) {
          bVar10 = false;
          if (TableY < pBox_00->nOutputs) {
            pPrev = Tim_ManBoxOutput(p,pBox_00,TableY);
            bVar10 = pPrev != (Tim_Obj_t *)0x0;
          }
          if ((((!bVar10) || (pTVar8->timeArr != pPrev->timeArr)) ||
              (NAN(pTVar8->timeArr) || NAN(pPrev->timeArr))) ||
             ((pTVar8->timeReq != pPrev->timeReq || (NAN(pTVar8->timeReq) || NAN(pPrev->timeReq)))))
          break;
          TableY = TableY + 1;
        }
        iVar7 = Tim_ManBoxOutputNum(p,pBox_00->iBox);
        if (TableY == iVar7) {
          printf("Box outputs :  arrival = %5.3f  required = %5.3f\n",(double)pTVar8->timeArr,
                 (double)pTVar8->timeReq);
        }
        else {
          TableY = 0;
          while( true ) {
            bVar10 = false;
            if (TableY < pBox_00->nOutputs) {
              pPrev = Tim_ManBoxOutput(p,pBox_00,TableY);
              bVar10 = pPrev != (Tim_Obj_t *)0x0;
            }
            if (!bVar10) break;
            printf("box-out%3d :  arrival = %5.3f  required = %5.3f\n",(double)pPrev->timeArr,
                   (double)pPrev->timeReq,(ulong)(uint)TableY);
            TableY = TableY + 1;
          }
        }
        if (2 < k) break;
      }
    }
    iVar7 = Tim_ManDelayTableNum(p);
    if (0 < iVar7) {
      for (k = 0; iVar7 = Vec_PtrSize(p->vDelayTables), k < iVar7; k = k + 1) {
        pfVar9 = (float *)Vec_PtrEntry(p->vDelayTables,k);
        if (pfVar9 != (float *)0x0) {
          printf("Delay table %d:\n",(ulong)(uint)k);
          if (k != (int)*pfVar9) {
            __assert_fail("i == (int)pTable[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                          ,0x25d,"void Tim_ManPrint(Tim_Man_t *)");
          }
          iVar7 = (int)pfVar9[1];
          fVar1 = pfVar9[2];
          TableX = 0;
          while (TableX < (int)fVar1) {
            for (TableY = 0; TableY < iVar7; TableY = TableY + 1) {
              if ((pfVar9[TableX * iVar7 + 3 + TableY] != -1e+09) ||
                 (NAN(pfVar9[TableX * iVar7 + 3 + TableY]))) {
                printf("%5.0f",(double)pfVar9[TableX * iVar7 + 3 + TableY]);
              }
              else {
                printf("%5s","-");
              }
            }
            TableX = TableX + 1;
            printf("\n");
          }
        }
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void Tim_ManPrint( Tim_Man_t * p )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj, * pPrev;
    float * pTable;
    int i, j, k, TableX, TableY;
    if ( p == NULL )
        return;
    printf( "TIMING MANAGER:\n" );
    printf( "PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), Tim_ManPoNum(p), Tim_ManCoNum(p), Tim_ManBoxNum(p) );

    // print CI info
    pPrev = p->pCis;
    Tim_ManForEachPi( p, pObj, i )
        if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
            break;
    if ( i == Tim_ManCiNum(p) )
        printf( "All PIs     :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
    else
        Tim_ManForEachPi( p, pObj, i )
            printf( "PI%5d     :  arrival = %5.3f  required = %5.3f\n", i, pObj->timeArr, pObj->timeReq );

    // print CO info
    pPrev = p->pCos;
    Tim_ManForEachPo( p, pObj, i )
        if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
            break;
    if ( i == Tim_ManCoNum(p) )
        printf( "All POs     :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
    else
    {
        int k = 0;
        Tim_ManForEachPo( p, pObj, i )
            printf( "PO%5d     :  arrival = %5.3f  required = %5.3f\n", k++, pObj->timeArr, pObj->timeReq );
    }

    // print box info
    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
    {
        printf( "*** Box %5d :  I =%4d. O =%4d. I1 =%6d. O1 =%6d. Table =%4d\n", 
            i, pBox->nInputs, pBox->nOutputs, 
            Tim_ManBoxInputFirst(p, i), Tim_ManBoxOutputFirst(p, i), 
            pBox->iDelayTable );

        // print box inputs
        pPrev = Tim_ManBoxInput( p, pBox, 0 );
        Tim_ManBoxForEachInput( p, pBox, pObj, k )
            if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
                break;
        if ( k == Tim_ManBoxInputNum(p, pBox->iBox) )
            printf( "Box inputs  :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
        else
            Tim_ManBoxForEachInput( p, pBox, pObj, k )
                printf( "box-in%4d :  arrival = %5.3f  required = %5.3f\n", k, pObj->timeArr, pObj->timeReq );

        // print box outputs
        pPrev = Tim_ManBoxOutput( p, pBox, 0 );
        Tim_ManBoxForEachOutput( p, pBox, pObj, k )
            if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
                break;
        if ( k == Tim_ManBoxOutputNum(p, pBox->iBox) )
            printf( "Box outputs :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
        else
            Tim_ManBoxForEachOutput( p, pBox, pObj, k )
                printf( "box-out%3d :  arrival = %5.3f  required = %5.3f\n", k, pObj->timeArr, pObj->timeReq );

        if ( i > 2 )
            break;
    }

    // print delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    Tim_ManForEachTable( p, pTable, i )
    {
        if ( pTable == NULL )
            continue;
        printf( "Delay table %d:\n", i );
        assert( i == (int)pTable[0] );
        TableX = (int)pTable[1];
        TableY = (int)pTable[2];
        for ( j = 0; j < TableY; j++, printf( "\n" ) )
            for ( k = 0; k < TableX; k++ )
                if ( pTable[3+j*TableX+k] == -ABC_INFINITY )
                    printf( "%5s", "-" );
                else
                    printf( "%5.0f", pTable[3+j*TableX+k] );
    }
    printf( "\n" );
}